

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O1

void __thiscall
Rml::ElementAnimation::ElementAnimation
          (ElementAnimation *this,PropertyId property_id,ElementAnimationOrigin origin,
          Property *current_value,Element *element,double start_world_time,float duration,
          int num_iterations,bool alternate_direction)

{
  Tween local_48;
  String local_38;
  
  this->property_id = property_id;
  this->duration = duration;
  this->num_iterations = num_iterations;
  this->alternate_direction = alternate_direction;
  (this->keys).super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keys).super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keys).super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->last_update_world_time = start_world_time;
  this->time_since_iteration_start = 0.0;
  this->current_iteration = 0;
  this->reverse_direction = false;
  this->animation_complete = false;
  this->origin = origin;
  if (current_value->definition == (PropertyDefinition *)0x0) {
    Property::ToString_abi_cxx11_(&local_38,current_value);
    Log::Message(LT_WARNING,
                 "Property in animation key did not have a definition (while adding key \'%s\').",
                 local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  Tween::Tween(&local_48,Linear,Out);
  InternalAddKey(this,0.0,current_value,element,local_48);
  return;
}

Assistant:

ElementAnimation::ElementAnimation(PropertyId property_id, ElementAnimationOrigin origin, const Property& current_value, Element& element,
	double start_world_time, float duration, int num_iterations, bool alternate_direction) :
	property_id(property_id), duration(duration), num_iterations(num_iterations), alternate_direction(alternate_direction),
	last_update_world_time(start_world_time), origin(origin)
{
	if (!current_value.definition)
	{
		Log::Message(Log::LT_WARNING, "Property in animation key did not have a definition (while adding key '%s').",
			current_value.ToString().c_str());
	}
	InternalAddKey(0.0f, current_value, element, Tween{});
}